

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::ElementsAreMatcherImpl<const_pstore::small_vector<int,_8UL>_&>::MatchAndExplain
          (ElementsAreMatcherImpl<const_pstore::small_vector<int,_8UL>_&> *this,
          small_vector<int,_8UL> *container,MatchResultListener *listener)

{
  ostream *poVar1;
  pointer pMVar2;
  bool bVar3;
  int iVar4;
  MatchResultListener *pMVar5;
  bool bVar6;
  long lVar7;
  size_t count;
  int *x;
  long lVar8;
  size_t sVar9;
  pointer pbVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  StringMatchResultListener s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  long *local_1e8 [2];
  long local_1d8 [2];
  undefined1 local_1c8 [32];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  poVar1 = listener->stream_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_200,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)local_1c8);
  x = container->buffer_;
  if (container->elements_ == 0) {
    sVar9 = 0;
    bVar6 = false;
  }
  else {
    lVar7 = 0;
    lVar8 = 0;
    sVar9 = 0;
    do {
      bVar6 = false;
      pMVar2 = (this->matchers_).
               super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (sVar9 == ((long)(this->matchers_).
                          super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 3) *
                   -0x5555555555555555) break;
      if (poVar1 == (ostream *)0x0) {
        local_1c8._8_8_ = (ostream *)0x0;
        local_1c8._0_8_ = &PTR__MatchResultListener_00249e50;
        bVar3 = MatcherBase<const_int_&>::MatchAndExplain
                          ((MatcherBase<const_int_&> *)
                           ((long)&(pMVar2->super_MatcherBase<const_int_&>).
                                   super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                           lVar8),x,(MatchResultListener *)local_1c8);
      }
      else {
        local_1c8._8_8_ = local_1a8;
        local_1c8._0_8_ = &PTR__StringMatchResultListener_00249f78;
        std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 0x10));
        bVar3 = MatcherBase<const_int_&>::MatchAndExplain
                          ((MatcherBase<const_int_&> *)
                           ((long)&(((this->matchers_).
                                     super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_MatcherBase<const_int_&>).super_MatcherDescriberInterface.
                                   _vptr_MatcherDescriberInterface + lVar8),x,
                           (MatchResultListener *)local_1c8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=
                  ((string *)
                   ((long)&((local_200.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7),
                   (string *)local_1e8);
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        local_1c8._0_8_ = &PTR__StringMatchResultListener_00249f78;
        std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 0x10));
        std::ios_base::~ios_base(local_138);
      }
      bVar6 = false;
      if (bVar3 == false) {
        bVar6 = true;
        break;
      }
      x = x + 1;
      sVar9 = sVar9 + 1;
      lVar8 = lVar8 + 0x18;
      lVar7 = lVar7 + 0x20;
    } while (x != container->buffer_ + container->elements_);
  }
  count = sVar9;
  if (x != container->buffer_ + container->elements_) {
    count = sVar9 + ((ulong)((long)(container->buffer_ + container->elements_) + (-4 - (long)x)) >>
                    2) + 1;
  }
  if (count == ((long)(this->matchers_).
                      super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->matchers_).
                      super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
    if (!bVar6) {
      bVar6 = true;
      if ((poVar1 != (ostream *)0x0) &&
         ((this->matchers_).
          super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->matchers_).
          super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
          ._M_impl.super__Vector_impl_data._M_start)) {
        lVar8 = 8;
        bVar3 = false;
        lVar7 = 0;
        do {
          pbVar10 = local_200.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(long *)((long)&((local_200.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar8) != 0) {
            if (bVar3) {
              MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
            }
            pMVar5 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
            if (pMVar5->stream_ != (ostream *)0x0) {
              std::ostream::_M_insert<unsigned_long>((ulong)pMVar5->stream_);
            }
            pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [11])" matches, ");
            bVar3 = true;
            if (pMVar5->stream_ != (ostream *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (pMVar5->stream_,*(char **)((long)pbVar10 + lVar8 + -8),
                         *(long *)((long)&(pbVar10->_M_dataplus)._M_p + lVar8));
            }
          }
          lVar7 = lVar7 + 1;
          lVar8 = lVar8 + 0x20;
        } while (lVar7 != ((long)(this->matchers_).
                                 super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->matchers_).
                                 super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555);
      }
      goto LAB_0016cd0b;
    }
    if (poVar1 != (ostream *)0x0) {
      pMVar5 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
      if (pMVar5->stream_ != (ostream *)0x0) {
        std::ostream::_M_insert<unsigned_long>((ulong)pMVar5->stream_);
      }
      MatchResultListener::operator<<(pMVar5,(char (*) [15])" doesn\'t match");
      pbVar10 = local_200.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + sVar9;
      poVar1 = listener->stream_;
      iVar4 = std::__cxx11::string::compare((char *)pbVar10);
      bVar6 = false;
      if ((poVar1 == (ostream *)0x0) || (bVar6 = false, iVar4 == 0)) goto LAB_0016cd0b;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length);
    }
  }
  else {
    bVar6 = false;
    if ((poVar1 == (ostream *)0x0) || (count == 0)) goto LAB_0016cd0b;
    pMVar5 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
    Elements((ElementsAreMatcherImpl<const_pstore::small_vector<int,_8UL>_&> *)local_1c8,count);
    MatchResultListener::operator<<(pMVar5,(Message *)local_1c8);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_1c8._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_1c8._0_8_ + 8))();
    }
  }
  bVar6 = false;
LAB_0016cd0b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_200);
  return bVar6;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    typename StlContainer::const_iterator it = stl_container.begin();
    size_t exam_pos = 0;
    bool mismatch_found = false;  // Have we found a mismatched element yet?

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        mismatch_found = true;
        break;
      }
    }
    // If mismatch_found is true, 'exam_pos' is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (mismatch_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        *listener << "whose element #" << exam_pos << " doesn't match";
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }